

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall chrono::ChAssembly::ChAssembly(ChAssembly *this,ChAssembly *other)

{
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChAssembly_00b390f0;
  (this->bodylist).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bodylist).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bodylist).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shaftlist).
  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shaftlist).
  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shaftlist).
  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->linklist).
  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->linklist).
  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->linklist).
  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nbodies = other->nbodies;
  this->nbodies_sleep = other->nbodies_sleep;
  this->nbodies_fixed = other->nbodies_fixed;
  this->nshafts = other->nshafts;
  this->nshafts_sleep = other->nshafts_sleep;
  this->nshafts_fixed = other->nshafts_fixed;
  this->nlinks = other->nlinks;
  this->nmeshes = other->nmeshes;
  this->nphysicsitems = other->nphysicsitems;
  this->ncoords = other->ncoords;
  this->ncoords_w = other->ncoords_w;
  this->ndoc = other->ndoc;
  this->ndoc_w = other->ndoc_w;
  this->ndoc_w_C = other->ndoc_w_C;
  this->ndoc_w_D = other->ndoc_w_D;
  this->ndof = other->ndof;
  this->nsysvars = other->nsysvars;
  this->nsysvars_w = other->nsysvars_w;
  return;
}

Assistant:

ChAssembly::ChAssembly(const ChAssembly& other) : ChPhysicsItem(other) {
    nbodies = other.nbodies;
    nbodies_sleep = other.nbodies_sleep;
    nbodies_fixed = other.nbodies_fixed;
    nshafts = other.nshafts;
    nshafts_sleep = other.nshafts_sleep;
    nshafts_fixed = other.nshafts_fixed;
    nlinks = other.nlinks;
    nmeshes = other.nmeshes;
    nphysicsitems = other.nphysicsitems;
    ncoords = other.ncoords;
    ncoords_w = other.ncoords_w;
    ndoc = other.ndoc;
    ndoc_w = other.ndoc_w;
    ndoc_w_C = other.ndoc_w_C;
    ndoc_w_D = other.ndoc_w_D;
    ndof = other.ndof;
    nsysvars = other.nsysvars;
    nsysvars_w = other.nsysvars_w;

    //// RADU
    //// TODO:  deep copy of the object lists (bodylist, shaftlist, linklist, meshlist,  otherphysicslist)
}